

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O2

Bool IsNodePushable(Node *node)

{
  Dict *pDVar1;
  Bool BVar2;
  
  pDVar1 = node->tag;
  BVar2 = no;
  if ((pDVar1 != (Dict *)0x0) && ((pDVar1->model & 0x810) == 0x10)) {
    BVar2 = (Bool)(pDVar1->id != TidyTag_DEL && pDVar1->id != TidyTag_INS);
  }
  return BVar2;
}

Assistant:

static Bool IsNodePushable( Node *node )
{
    if (node->tag == NULL)
        return no;

    if (!(node->tag->model & CM_INLINE))
        return no;

    if (node->tag->model & CM_OBJECT)
        return no;

    /*\ Issue #92: OLD problem of ins and del which are marked as both
     *  inline and block, thus should NOT ever be 'inserted'
    \*/
    if (nodeIsINS(node) || nodeIsDEL(node))
        return no;

    return yes;
}